

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  ProfileId profileId;
  uint offset;
  Var target;
  RecyclableObject *function;
  FunctionBody *functionBody;
  AuxArray<unsigned_int> *local_40;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  target = GetRegAllowStackVar<unsigned_short>
                     (this,(playout->
                           super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                           super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Function)
  ;
  function = OP_CallGetFunc(this,target);
  profileId = playout->profileId;
  if (((playout->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Options &
      CallIExtended_SpreadArgs) == CallIExtended_None) {
    local_40 = (AuxArray<unsigned_int> *)0x0;
  }
  else {
    offset = (playout->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
             SpreadAuxOffset;
    functionBody = GetFunctionBody(this);
    local_40 = ByteCodeReader::ReadAuxArray<unsigned_int>(offset,functionBody);
  }
  OP_ProfileCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
            (this,playout,function,0,profileId,0xffffffff,local_40);
  return;
}

Assistant:

void OP_ProfiledCallIFlags(const unaligned T* playout) { OP_ProfileCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), playout->callFlags, playout->profileId); }